

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool google::protobuf::compiler::anon_unknown_0::TryCreateParentDirectory
               (string *prefix,string *filename)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  char *pcVar4;
  int *piVar5;
  ostream *poVar6;
  int local_68;
  int i;
  string local_58 [8];
  string path_so_far;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string *filename_local;
  string *prefix_local;
  
  Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)((long)&path_so_far.field_2 + 8),filename,"/",true);
  std::__cxx11::string::string(local_58,(string *)prefix);
  local_68 = 0;
  do {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&path_so_far.field_2 + 8));
    if (sVar2 - 1 <= (ulong)(long)local_68) {
      prefix_local._7_1_ = true;
LAB_00357ba5:
      std::__cxx11::string::~string(local_58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&path_so_far.field_2 + 8));
      return prefix_local._7_1_;
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&path_so_far.field_2 + 8),(long)local_68);
    std::__cxx11::string::operator+=(local_58,(string *)pvVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iVar1 = mkdir(pcVar4,0x1ff);
    if ((iVar1 != 0) && (piVar5 = __errno_location(), *piVar5 != 0x11)) {
      poVar6 = std::operator<<((ostream *)&std::cerr,(string *)filename);
      poVar6 = std::operator<<(poVar6,": while trying to create directory ");
      poVar6 = std::operator<<(poVar6,local_58);
      poVar6 = std::operator<<(poVar6,": ");
      piVar5 = __errno_location();
      pcVar4 = strerror(*piVar5);
      poVar6 = std::operator<<(poVar6,pcVar4);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      prefix_local._7_1_ = false;
      goto LAB_00357ba5;
    }
    std::__cxx11::string::operator+=(local_58,'/');
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

bool TryCreateParentDirectory(const string& prefix, const string& filename) {
  // Recursively create parent directories to the output file.
  std::vector<string> parts =
      Split(filename, "/", true);
  string path_so_far = prefix;
  for (int i = 0; i < parts.size() - 1; i++) {
    path_so_far += parts[i];
    if (mkdir(path_so_far.c_str(), 0777) != 0) {
      if (errno != EEXIST) {
        std::cerr << filename << ": while trying to create directory "
                  << path_so_far << ": " << strerror(errno) << std::endl;
        return false;
      }
    }
    path_so_far += '/';
  }

  return true;
}